

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O3

bool __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::get_peers
          (dht_default_storage *this,sha1_hash *info_hash,bool noseed,bool scrape,address *requester
          ,entry *peers)

{
  _Rb_tree_header *p_Var1;
  anon_enum_32 aVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  _Base_ptr p_Var9;
  entry *peVar10;
  pointer pcVar11;
  list_type *this_00;
  string_type *psVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  peer_entry *bits;
  aux *this_01;
  difference_type __d;
  char *pcVar17;
  ulong uVar18;
  uint uVar19;
  aux *paVar20;
  _Base_ptr p_Var21;
  peer_entry *p;
  long lVar22;
  aux *paVar23;
  bool bVar24;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  size_type __dnew;
  sha1_hash iphash;
  bloom_filter<256> seeds;
  peer_entry requester_entry;
  address local_2c8;
  string_type local_2a8;
  string_type local_288;
  string_type local_268;
  sha1_hash local_244;
  undefined1 local_230 [8];
  data_union local_228 [8];
  peer_entry local_130 [6];
  
  p_Var9 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var9 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_map)._M_t._M_impl.super__Rb_tree_header;
    p_Var21 = &p_Var1->_M_header;
    do {
      lVar14 = 0;
      do {
        uVar19 = *(uint *)((long)&p_Var9[1]._M_color + lVar14);
        uVar7 = *(uint *)((long)(info_hash->m_number)._M_elems + lVar14);
        if (uVar19 != uVar7) break;
        bVar24 = lVar14 != 0x10;
        lVar14 = lVar14 + 4;
      } while (bVar24);
      bVar24 = (uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18)
               < (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
      if (!bVar24) {
        p_Var21 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[bVar24];
    } while (p_Var9 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var21 != p_Var1) {
      lVar14 = 0;
      do {
        uVar19 = *(uint *)((long)(info_hash->m_number)._M_elems + lVar14);
        uVar7 = *(uint *)((long)&p_Var21[1]._M_color + lVar14);
        if (uVar19 != uVar7) break;
        bVar24 = lVar14 != 0x10;
        lVar14 = lVar14 + 4;
      } while (bVar24);
      if ((uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18) <=
          (uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18)) {
        lVar14 = 0x50;
        if (requester->type_ == ipv4) {
          lVar14 = 0x38;
        }
        if (*(long *)(p_Var21 + 2) != 0) {
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2a8,p_Var21[1]._M_right,
                     (long)&(p_Var21[1]._M_right)->_M_color + *(long *)(p_Var21 + 2));
          key._M_str = "n";
          key._M_len = 1;
          peVar10 = entry::operator[](peers,key);
          entry::operator=(peVar10,&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
        }
        if (scrape) {
          memset(local_130,0,0x100);
          memset(local_230,0,0x100);
          lVar22 = *(long *)((long)&p_Var21[1]._M_color + lVar14);
          lVar15 = *(long *)((long)&p_Var21[1]._M_parent + lVar14);
          if (lVar22 != lVar15) {
            do {
              bVar24 = *(short *)(lVar22 + 8) != 2;
              if (bVar24) {
                local_2c8.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)(lVar22 + 0x10);
                local_2c8.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)(lVar22 + 0x18);
                local_2c8.ipv6_address_.scope_id_ = (unsigned_long)*(uint *)(lVar22 + 0x20);
                local_2c8.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
              }
              else {
                local_2c8.ipv4_address_.addr_.s_addr = *(in4_addr_type *)(lVar22 + 0xc);
                local_2c8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
                local_2c8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
                local_2c8.ipv6_address_.scope_id_ = 0;
              }
              local_2c8.type_ = (uint)bVar24;
              aux::hash_address(&local_244,&local_2c8);
              bits = local_130;
              if (*(char *)(lVar22 + 0x24) != '\0') {
                bits = (peer_entry *)local_230;
              }
              aux::set_bits((uint8_t *)&local_244,(uint8_t *)bits,0x100);
              lVar22 = lVar22 + 0x28;
            } while (lVar22 != lVar15);
          }
          local_2c8.type_ = 0x100;
          local_2c8.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          pcVar11 = (pointer)::std::__cxx11::string::_M_create
                                       ((ulong *)&local_268,(ulong)&local_2c8);
          uVar4 = local_2c8._0_8_;
          local_268.field_2._M_allocated_capacity._0_4_ = local_2c8.type_;
          local_268.field_2._M_allocated_capacity._4_4_ = local_2c8.ipv4_address_.addr_.s_addr;
          local_268._M_dataplus._M_p = pcVar11;
          memcpy(pcVar11,local_130,0x100);
          uVar5 = local_2c8._0_8_;
          local_2c8.type_ = (anon_enum_32)uVar4;
          local_2c8.ipv4_address_.addr_.s_addr = SUB84(uVar4,4);
          local_268._M_string_length._0_4_ = local_2c8.type_;
          local_268._M_string_length._4_4_ = local_2c8.ipv4_address_.addr_.s_addr;
          pcVar11[uVar4] = '\0';
          key_00._M_str = "BFpe";
          key_00._M_len = 4;
          local_2c8._0_8_ = uVar5;
          peVar10 = entry::operator[](peers,key_00);
          entry::operator=(peVar10,&local_268);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          local_2c8.type_ = 0x100;
          local_2c8.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          pcVar11 = (pointer)::std::__cxx11::string::_M_create
                                       ((ulong *)&local_288,(ulong)&local_2c8);
          uVar4 = local_2c8._0_8_;
          local_288.field_2._M_allocated_capacity._0_4_ = local_2c8.type_;
          local_288.field_2._M_allocated_capacity._4_4_ = local_2c8.ipv4_address_.addr_.s_addr;
          local_288._M_dataplus._M_p = pcVar11;
          memcpy(pcVar11,local_230,0x100);
          uVar5 = local_2c8._0_8_;
          local_2c8.type_ = (anon_enum_32)uVar4;
          local_2c8.ipv4_address_.addr_.s_addr = SUB84(uVar4,4);
          local_288._M_string_length._0_4_ = local_2c8.type_;
          local_288._M_string_length._4_4_ = local_2c8.ipv4_address_.addr_.s_addr;
          pcVar11[uVar4] = '\0';
          key_01._M_str = "BFsd";
          key_01._M_len = 4;
          local_2c8._0_8_ = uVar5;
          peVar10 = entry::operator[](peers,key_01);
          entry::operator=(peVar10,&local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          aVar2 = requester->type_;
          uVar7 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x4089);
          uVar19 = uVar7 + 3;
          if (-1 < (int)uVar7) {
            uVar19 = uVar7;
          }
          uVar19 = (int)uVar19 >> 2;
          if (aVar2 == ipv4) {
            uVar19 = uVar7;
          }
          if (*(long *)((long)&p_Var21[1]._M_color + lVar14) ==
              *(long *)((long)&p_Var21[1]._M_parent + lVar14)) {
            uVar19 = uVar7;
          }
          key_02._M_str = "values";
          key_02._M_len = 6;
          peVar10 = entry::operator[](peers,key_02);
          this_00 = entry::list(peVar10);
          this_01 = (aux *)0x0;
          lVar22 = *(long *)((long)&p_Var21[1]._M_color + lVar14);
          for (lVar15 = lVar22; lVar15 != *(long *)((long)&p_Var21[1]._M_parent + lVar14);
              lVar15 = lVar15 + 0x28) {
            uVar7 = ~*(uint *)(lVar15 + 0x24) & 1;
            if (!noseed) {
              uVar7 = 1;
            }
            this_01 = (aux *)(ulong)((int)this_01 + uVar7);
          }
          paVar20 = (aux *)(ulong)uVar19;
          if ((int)this_01 <= (int)uVar19) {
            paVar20 = this_01;
          }
          if (0 < (int)paVar20) {
            pcVar17 = (char *)(lVar22 + 0x24);
            do {
              if ((!noseed) || (*pcVar17 == '\0')) {
                paVar23 = (aux *)(ulong)((int)this_01 - 1);
                lVar22 = aux::random(this_01);
                this_01 = paVar23;
                if ((uint)lVar22 <= (uint)paVar20) {
                  ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::
                  emplace_back<>(this_00);
                  psVar12 = entry::string_abi_cxx11_
                                      ((this_00->
                                       super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                                       )._M_impl.super__Vector_impl_data._M_finish + -1);
                  ::std::__cxx11::string::resize((ulong)psVar12,'\x12');
                  local_130[0].added.__d.__r = (duration)(psVar12->_M_dataplus)._M_p;
                  aux::
                  write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&>
                            ((basic_endpoint<boost::asio::ip::tcp> *)(pcVar17 + -0x1c),
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_130);
                  ::std::__cxx11::string::resize
                            ((ulong)psVar12,
                             (char)local_130[0].added.__d.__r - (char)(psVar12->_M_dataplus)._M_p);
                  paVar20 = (aux *)(ulong)((uint)paVar20 - 1);
                }
              }
              pcVar17 = pcVar17 + 0x28;
            } while (0 < (int)paVar20);
          }
        }
        iVar6 = (int)((ulong)(*(long *)((long)&p_Var21[1]._M_parent + lVar14) -
                             *(long *)((long)&p_Var21[1]._M_color + lVar14)) >> 3);
        iVar16 = iVar6 * -0x33333333;
        iVar8 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x408e);
        if (iVar8 != iVar16 && SBORROW4(iVar8,iVar16) == iVar8 + iVar6 * 0x33333333 < 0) {
          return false;
        }
        local_130[0].added.__d.__r = (duration)0;
        local_130[0].addr.impl_.data_._8_1_ = '\0';
        local_130[0].addr.impl_.data_._9_1_ = '\0';
        local_130[0].addr.impl_.data_._10_1_ = '\0';
        local_130[0].addr.impl_.data_._11_1_ = '\0';
        local_130[0].addr.impl_.data_._12_1_ = '\0';
        local_130[0].addr.impl_.data_._13_1_ = '\0';
        local_130[0].addr.impl_.data_._14_1_ = '\0';
        local_130[0].addr.impl_.data_._15_1_ = '\0';
        local_130[0].addr.impl_.data_._16_8_ = 0;
        local_130[0].addr.impl_.data_.v6.sin6_scope_id = 0;
        local_130[0].addr.impl_.data_._0_8_ = 2;
        local_130[0].seed = false;
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(&local_130[0].addr,requester)
        ;
        lVar22 = *(long *)((long)&p_Var21[1]._M_color + lVar14);
        lVar14 = *(long *)((long)&p_Var21[1]._M_parent + lVar14);
        uVar13 = lVar14 - lVar22;
        if (0 < (long)uVar13) {
          uVar13 = (uVar13 >> 3) * -0x3333333333333333;
          do {
            uVar18 = uVar13 >> 1;
            bVar24 = operator<((peer_entry *)(lVar22 + uVar18 * 0x28),local_130);
            if (bVar24) {
              lVar22 = lVar22 + uVar18 * 0x28 + 0x28;
              uVar18 = ~uVar18 + uVar13;
            }
            uVar13 = uVar18;
          } while (0 < (long)uVar18);
        }
        if (lVar22 != lVar14) {
          bVar24 = *(short *)(lVar22 + 8) != 2;
          if (bVar24) {
            local_228[0]._0_8_ = *(undefined8 *)(lVar22 + 0x10);
            local_228[0]._8_8_ = *(uchar (*) [8])(lVar22 + 0x18);
            local_228[0]._16_8_ = ZEXT48(*(uint *)(lVar22 + 0x20));
            local_230._4_4_ = 0;
          }
          else {
            local_230._4_4_ = *(in_addr_t *)(lVar22 + 0xc);
            local_228[0]._0_8_ = 0;
            local_228[0]._8_1_ = '\0';
            local_228[0]._9_1_ = '\0';
            local_228[0]._10_1_ = '\0';
            local_228[0]._11_1_ = '\0';
            local_228[0]._12_1_ = '\0';
            local_228[0]._13_1_ = '\0';
            local_228[0]._14_1_ = '\0';
            local_228[0]._15_1_ = '\0';
            local_228[0]._16_8_ = 0;
          }
          local_230._0_4_ = ZEXT14(bVar24);
          bVar24 = boost::asio::ip::operator!=((address *)local_230,requester);
          return bVar24;
        }
        return true;
      }
    }
  }
  sVar3 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  iVar6 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x408c);
  return iVar6 <= (int)sVar3;
}

Assistant:

bool get_peers(sha1_hash const& info_hash
			, bool const noseed, bool const scrape, address const& requester
			, entry& peers) const override
		{
			auto const i = m_map.find(info_hash);
			if (i == m_map.end()) return int(m_map.size()) >= m_settings.get_int(settings_pack::dht_max_torrents);

			torrent_entry const& v = i->second;
			auto const& peersv = requester.is_v4() ? v.peers4 : v.peers6;

			if (!v.name.empty()) peers["n"] = v.name;

			if (scrape)
			{
				aux::bloom_filter<256> downloaders;
				aux::bloom_filter<256> seeds;

				for (auto const& p : peersv)
				{
					sha1_hash const iphash = aux::hash_address(p.addr.address());
					if (p.seed) seeds.set(iphash);
					else downloaders.set(iphash);
				}

				peers["BFpe"] = downloaders.to_string();
				peers["BFsd"] = seeds.to_string();
			}
			else
			{
				tcp const protocol = requester.is_v4() ? tcp::v4() : tcp::v6();
				int to_pick = m_settings.get_int(settings_pack::dht_max_peers_reply);
				TORRENT_ASSERT(to_pick >= 0);
				// if these are IPv6 peers their addresses are 4x the size of IPv4
				// so reduce the max peers 4 fold to compensate
				// max_peers_reply should probably be specified in bytes
				if (!peersv.empty() && protocol == tcp::v6())
					to_pick /= 4;
				entry::list_type& pe = peers["values"].list();

				int candidates = int(std::count_if(peersv.begin(), peersv.end()
					, [=](peer_entry const& e) { return !(noseed && e.seed); }));

				to_pick = std::min(to_pick, candidates);

				for (auto iter = peersv.begin(); to_pick > 0; ++iter)
				{
					// if the node asking for peers is a seed, skip seeds from the
					// peer list
					if (noseed && iter->seed) continue;

					TORRENT_ASSERT(candidates >= to_pick);

					// pick this peer with probability
					// <peers left to pick> / <peers left in the set>
					if (aux::random(std::uint32_t(candidates--)) > std::uint32_t(to_pick))
						continue;

					pe.emplace_back();
					std::string& str = pe.back().string();

					str.resize(18);
					std::string::iterator out = str.begin();
					aux::write_endpoint(iter->addr, out);
					str.resize(std::size_t(out - str.begin()));

					--to_pick;
				}
			}

			if (int(peersv.size()) < m_settings.get_int(settings_pack::dht_max_peers))
				return false;

			// we're at the max peers stored for this torrent
			// only send a write token if the requester is already in the set
			// only check for a match on IP because the peer may be announcing
			// a different port than the one it is using to send DHT messages
			peer_entry requester_entry;
			requester_entry.addr.address(requester);
			auto requester_iter = std::lower_bound(peersv.begin(), peersv.end(), requester_entry);
			return requester_iter == peersv.end()
				|| requester_iter->addr.address() != requester;
		}